

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_get_user_reg_aarch64(CPUARMState_conflict *env,uint32_t regno)

{
  uint32_t local_18;
  uint32_t val;
  uint32_t regno_local;
  CPUARMState_conflict *env_local;
  
  if (regno == 0xd) {
    local_18 = env->banked_r13[0];
  }
  else if (regno == 0xe) {
    local_18 = env->banked_r14[0];
  }
  else if ((regno < 8) || ((env->uncached_cpsr & 0x1f) != 0x11)) {
    local_18 = env->regs[regno];
  }
  else {
    local_18 = env->usr_regs[regno - 8];
  }
  return local_18;
}

Assistant:

uint32_t HELPER(get_user_reg)(CPUARMState *env, uint32_t regno)
{
    uint32_t val;

    if (regno == 13) {
        val = env->banked_r13[BANK_USRSYS];
    } else if (regno == 14) {
        val = env->banked_r14[BANK_USRSYS];
    } else if (regno >= 8
               && (env->uncached_cpsr & 0x1f) == ARM_CPU_MODE_FIQ) {
        val = env->usr_regs[regno - 8];
    } else {
        val = env->regs[regno];
    }
    return val;
}